

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_archiver.cpp
# Opt level: O1

void __thiscall HuffmanArchiver::unzip(HuffmanArchiver *this,istream *cin,ostream *cout)

{
  HuffmanArchiver *pHVar1;
  char data;
  pair<bool,_char> pVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  vector<bool,_std::allocator<bool>_> code;
  BitReader in;
  HuffTree tree;
  pair<bool,_char> node;
  vector<bool,_std::allocator<bool>_> local_118;
  int local_ec;
  long local_e8;
  BitReader local_e0;
  HuffTree local_d0;
  vector<bool,_std::allocator<bool>_> local_c0;
  istream *local_98;
  HuffmanArchiver *local_90;
  ostream *local_88;
  vector<bool,_std::allocator<bool>_> local_80;
  vector<bool,_std::allocator<bool>_> local_58;
  
  local_88 = cout;
  HuffTree::HuffTree(&local_d0);
  local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ =
       (ulong)(uint)local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ << 0x20;
  local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ =
       (ulong)(uint)local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_ << 0x20;
  local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  BitReader::BitReader(&local_e0,cin);
  iVar3 = BitReader::read_buf(&local_e0,0x40);
  this->num_of_symbols_out = (long)iVar3;
  local_ec = BitReader::read_buf(&local_e0,0x20);
  local_98 = cin;
  local_90 = this;
  iVar3 = BitReader::read_buf(&local_e0,0x10);
  local_e8 = (long)iVar3;
  if (iVar3 != 0) {
    lVar6 = 0;
    do {
      local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p =
           local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
      local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._8_8_ =
           local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
      data = BitReader::read_char(&local_e0);
      iVar3 = local_ec;
      if (0 < local_ec) {
        do {
          iVar4 = BitReader::read_buf(&local_e0,1);
          std::vector<bool,_std::allocator<bool>_>::push_back(&local_118,iVar4 != 0);
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      std::__reverse<std::_Bit_iterator>
                (local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,0,
                 local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p,
                 local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff);
      std::vector<bool,_std::allocator<bool>_>::vector(&local_58,&local_118);
      decode_full_code(&local_c0,&local_58);
      if (local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
      local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage =
           local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_end_of_storage;
      local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._8_8_ =
           CONCAT44(local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_,
                    local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
      local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._8_8_ =
           CONCAT44(local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_,
                    local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset);
      local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p =
           local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p;
      local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p =
           local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
      local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = 0;
      local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_offset = 0;
      local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
        local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
      }
      std::vector<bool,_std::allocator<bool>_>::vector(&local_80,&local_118);
      HuffTree::add_code(&local_d0,data,&local_80);
      if (local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
        local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != local_e8);
  }
  pHVar1 = local_90;
  local_90->used_additional_bytes = local_e8 * (local_ec + 8) + 0x70U >> 3;
  local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       ((ulong)local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p & 0xffffffffffff0000);
  HuffTree::back_to_root(&local_d0);
  if (pHVar1->num_of_symbols_out != 0) {
    uVar5 = 0;
    do {
      iVar3 = BitReader::read_buf(&local_e0,1);
      pVar2 = HuffTree::walk(&local_d0,iVar3 != 0);
      local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p =
           (_Bit_type *)
           CONCAT62(local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._2_6_,pVar2);
      if (((ushort)pVar2 & 1) != 0) {
        std::ostream::write((char *)local_88,
                            (long)((long)&local_c0.super__Bvector_base<std::allocator<bool>_>.
                                          _M_impl.super__Bvector_impl_data._M_start.
                                          super__Bit_iterator_base._M_p + 1));
        HuffTree::back_to_root(&local_d0);
        uVar5 = uVar5 + 1;
      }
    } while (uVar5 < pHVar1->num_of_symbols_out);
  }
  lVar6 = std::istream::tellg();
  pHVar1->num_of_symbols_in = lVar6 - pHVar1->used_additional_bytes;
  if (local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._8_8_ =
         local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._8_8_ =
         local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
            (&local_d0.root);
  return;
}

Assistant:

void HuffmanArchiver::unzip(std::istream &cin, std::ostream &cout) {
    HuffTree tree;
    std::vector<bool> code;

    BitReader in(cin);

    num_of_symbols_out = static_cast<std::size_t>(in.read_buf(BITS_IN_SIZE_T));
    int full_code_size = in.read_buf(BITS_IN_INT);
    auto size = static_cast<std::size_t>(in.read_buf(ALPHABET_SIZE));

    char ch;
    for (std::size_t i = 0; i < size; i++) {
        code.clear();
        ch = in.read_char();
        for (int j = 0; j < full_code_size; j++) {
            code.push_back(static_cast<bool>(in.read_buf(1)));
        }
        std::reverse(code.begin(), code.end());
        code = decode_full_code(code);
        tree.add_code(ch, code);
    }

    used_additional_bytes = BITS_IN_SIZE_T + ALPHABET_SIZE + size * (BITS_IN_BYTE + full_code_size)
                            + BITS_IN_INT;
    used_additional_bytes /= BITS_IN_BYTE;

    bool bit;
    std::pair<bool, char> node;
    tree.back_to_root();
    std::size_t i = 0;
    while (i < num_of_symbols_out) {
        bit = (bool) in.read_buf(1);
        node = tree.walk(bit);
        if (node.first) {
            cout.write(reinterpret_cast<const char *>(&node.second), 1);
            tree.back_to_root();
            i++;
        }
    }
    num_of_symbols_in = static_cast<std::size_t >(cin.tellg()) - used_additional_bytes;
}